

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O2

void __thiscall scApp::captureOption(scApp *this,argparser *parser,HasArg hasArg)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (hasArg != eRequired) {
    iVar1 = -1;
    if ((hasArg != eOptional) || ((parser->optarg)._M_string_length == 0)) goto LAB_0010cb3b;
  }
  iVar1 = -2;
LAB_0010cb3b:
  std::operator+(&local_30,
                 (parser->argv).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (iVar1 + parser->optind)," ");
  std::__cxx11::string::append((string *)&this->scparams);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
scApp::captureOption(const argparser& parser, HasArg hasArg)
{
    uint32_t indexDecrement = 1;
    bool captureArg = false;

    if ((hasArg == eOptional && parser.optarg.size() > 0) || hasArg == eRequired)
        indexDecrement = 2;
    scparams += parser.argv[parser.optind - indexDecrement] + " ";
    if (captureArg)
        scparams += parser.optarg + " ";
}